

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

optional_ptr<duckdb::CopyToFileInfo,_true> __thiscall
duckdb::CopyToFunctionGlobalState::AddFile
          (CopyToFunctionGlobalState *this,StorageLockKey *l,string *file_name,
          CopyFunctionReturnType return_type)

{
  pointer pcVar1;
  CopyToFileInfo *this_00;
  pointer __p;
  pointer pCVar2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CopyToFileInfo_*,_false> _Var3;
  _Head_base<0UL,_duckdb::CopyToFileInfo_*,_false> local_58;
  string local_50;
  pointer local_30;
  
  this_00 = (CopyToFileInfo *)operator_new(0x68);
  pcVar1 = (file_name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + file_name->_M_string_length);
  CopyToFileInfo::CopyToFileInfo(this_00,&local_50);
  local_58._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (return_type == WRITTEN_FILE_STATISTICS) {
    __p = (pointer)operator_new(0x88);
    *(undefined8 *)&(__p->column_statistics)._M_h._M_rehash_policy = 0;
    (__p->column_statistics)._M_h._M_rehash_policy._M_next_resize = 0;
    (__p->column_statistics)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p->column_statistics)._M_h._M_element_count = 0;
    (__p->column_statistics)._M_h._M_buckets = (__buckets_ptr)0x0;
    (__p->column_statistics)._M_h._M_bucket_count = 0;
    (__p->footer_size_bytes).value_info_.internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__p->footer_size_bytes).value_info_.internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__p->footer_size_bytes).value_.bigint = 0;
    (__p->footer_size_bytes).value_.hugeint.upper = 0;
    (__p->footer_size_bytes).type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&(__p->footer_size_bytes).is_null = 0;
    (__p->footer_size_bytes).type_.id_ = INVALID;
    (__p->footer_size_bytes).type_.physical_type_ = ~INVALID;
    *(undefined6 *)&(__p->footer_size_bytes).type_.field_0x2 = 0;
    (__p->footer_size_bytes).type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__p->column_statistics)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    __p->row_count = 0;
    __p->file_size_bytes = 0;
    LogicalType::LogicalType((LogicalType *)&local_50,SQLNULL);
    Value::Value(&__p->footer_size_bytes,(LogicalType *)&local_50);
    LogicalType::~LogicalType((LogicalType *)&local_50);
    (__p->column_statistics)._M_h._M_buckets = &(__p->column_statistics)._M_h._M_single_bucket;
    (__p->column_statistics)._M_h._M_bucket_count = 1;
    (__p->column_statistics)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p->column_statistics)._M_h._M_element_count = 0;
    (__p->column_statistics)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__p->column_statistics)._M_h._M_rehash_policy._M_next_resize = 0;
    (__p->column_statistics)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_30 = __p;
    pCVar2 = unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>::
             operator->((unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
                         *)&local_58);
    ::std::
    __uniq_ptr_impl<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>_>
    ::reset((__uniq_ptr_impl<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>_>
             *)&pCVar2->file_stats,__p);
    _Var3._M_head_impl = local_58._M_head_impl;
  }
  else {
    _Var3._M_head_impl = (CopyToFileInfo *)0x0;
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>>
            ((vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,std::default_delete<duckdb::CopyToFileInfo>,true>>>
              *)&this->written_files,
             (unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
              *)&local_58);
  if (local_58._M_head_impl != (CopyToFileInfo *)0x0) {
    ::std::default_delete<duckdb::CopyToFileInfo>::operator()
              ((default_delete<duckdb::CopyToFileInfo> *)&local_58,local_58._M_head_impl);
  }
  return (optional_ptr<duckdb::CopyToFileInfo,_true>)_Var3._M_head_impl;
}

Assistant:

optional_ptr<CopyToFileInfo> AddFile(const StorageLockKey &l, const string &file_name,
	                                     CopyFunctionReturnType return_type) {
		D_ASSERT(l.GetType() == StorageLockType::EXCLUSIVE);
		auto file_info = make_uniq<CopyToFileInfo>(file_name);
		optional_ptr<CopyToFileInfo> result;
		if (return_type == CopyFunctionReturnType::WRITTEN_FILE_STATISTICS) {
			file_info->file_stats = make_uniq<CopyFunctionFileStatistics>();
			result = file_info.get();
		}
		written_files.push_back(std::move(file_info));
		return result;
	}